

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_fast_union_64(void **param_1)

{
  bool bVar1;
  uint32_t offset;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Roaring64Map r1_map;
  Roaring64Map r0_map;
  Roaring64Map *maps [3];
  Roaring64Map expected;
  Roaring64Map r2_map;
  Roaring64Map actual;
  
  for (uVar3 = 0; uVar3 != 0x10; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar2 != 0x10; uVar2 = uVar2 + 1) {
      for (uVar4 = 0; uVar4 != 0x10; uVar4 = uVar4 + 1) {
        r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        r0_map.roarings._M_t._M_impl._0_8_ = 0;
        r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        r1_map.roarings._M_t._M_impl._0_8_ = 0;
        r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        offset = 0;
        r0_map.copyOnWrite = false;
        r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        r1_map.copyOnWrite = false;
        r2_map.roarings._M_t._M_impl._0_8_ = 0;
        r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        r2_map.copyOnWrite = false;
        r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             r1_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             r0_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             r2_map.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&r0_map,(Roaring64Map *)(uVar3 & 0xffffffff),0,0);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&r1_map,(Roaring64Map *)(uVar2 & 0xffffffff),0x1000,
                   offset);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&r2_map,(Roaring64Map *)(uVar4 & 0xffffffff),0x2000,
                   offset);
        maps[0] = &r0_map;
        maps[1] = &r1_map;
        maps[2] = &r2_map;
        roaring::Roaring64Map::fastunion(&actual,3,maps);
        expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        expected.roarings._M_t._M_impl._0_8_ = 0;
        expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        expected.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        expected.copyOnWrite = false;
        expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             expected.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&expected,(Roaring64Map *)(uVar3 & 0xffffffff),0,
                   offset);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&expected,(Roaring64Map *)(uVar2 & 0xffffffff),0x1000,
                   offset);
        test_cpp_fast_union_64::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&expected,(Roaring64Map *)(uVar4 & 0xffffffff),0x2000,
                   offset);
        bVar1 = roaring::Roaring64Map::operator==(&expected,&actual);
        _assert_true((ulong)bVar1,"expected == actual",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
                     ,0x7c6);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&expected);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&actual);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&r2_map);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&r1_map);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)&r0_map);
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_cpp_fast_union_64) {
    auto update = [](Roaring64Map *dest, uint32_t bitmask, uint32_t offset) {
        for (uint32_t i = 0; i != 32; ++i) {
            if ((bitmask & (1 << i)) != 0) {
                dest->add(offset + i);
            }
        }
    };

    // Generate three Roaring64Maps that have a variety of combinations of
    // present and absent slots and calculate their union with fastunion.
    const uint32_t num_slots_to_test = 4;
    const uint32_t bitmask_limit = 1 << num_slots_to_test;

    for (size_t r0_bitmask = 0; r0_bitmask != bitmask_limit; ++r0_bitmask) {
        for (size_t r1_bitmask = 0; r1_bitmask != bitmask_limit; ++r1_bitmask) {
            for (size_t r2_bitmask = 0; r2_bitmask != bitmask_limit;
                 ++r2_bitmask) {
                Roaring64Map r0_map, r1_map, r2_map;
                update(&r0_map, r0_bitmask, 0);
                update(&r1_map, r1_bitmask, 0x1000);
                update(&r2_map, r2_bitmask, 0x2000);

                const Roaring64Map *maps[] = {&r0_map, &r1_map, &r2_map};
                auto actual = Roaring64Map::fastunion(3, maps);

                Roaring64Map expected;
                update(&expected, r0_bitmask, 0);
                update(&expected, r1_bitmask, 0x1000);
                update(&expected, r2_bitmask, 0x2000);

                assert_true(expected == actual);
            }
        }
    }
}